

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits_container_tests.cpp
# Opt level: O3

bool anon_unknown.dwarf_616b529::ns::operator==
               (Project<std::set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                *lhs,Project<std::set<(anonymous_namespace)::ns::Value,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>_>
                     *rhs)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  
  if ((lhs->version == rhs->version) &&
     (sVar1 = (lhs->name)._M_string_length, sVar1 == (rhs->name)._M_string_length)) {
    if ((sVar1 != 0) &&
       (iVar3 = bcmp((lhs->name)._M_dataplus._M_p,(rhs->name)._M_dataplus._M_p,sVar1), iVar3 != 0))
    {
      return false;
    }
    sVar1 = (lhs->author)._M_string_length;
    if (sVar1 == (rhs->author)._M_string_length) {
      if ((sVar1 != 0) &&
         (iVar3 = bcmp((lhs->author)._M_dataplus._M_p,(rhs->author)._M_dataplus._M_p,sVar1),
         iVar3 != 0)) {
        return false;
      }
      sVar1 = (lhs->notes)._M_string_length;
      if (sVar1 == (rhs->notes)._M_string_length) {
        if ((sVar1 != 0) &&
           (iVar3 = bcmp((lhs->notes)._M_dataplus._M_p,(rhs->notes)._M_dataplus._M_p,sVar1),
           iVar3 != 0)) {
          return false;
        }
        if (lhs->showNotes == rhs->showNotes) {
          bVar2 = std::operator==(&(lhs->values)._M_t,
                                  (_Rb_tree<(anonymous_namespace)::ns::Value,_(anonymous_namespace)::ns::Value,_std::_Identity<(anonymous_namespace)::ns::Value>,_std::less<(anonymous_namespace)::ns::Value>,_std::allocator<(anonymous_namespace)::ns::Value>_>
                                   *)(rhs->values)._M_t._M_impl.super__Rb_tree_header._M_header.
                                     _M_left);
          return bVar2;
        }
      }
    }
  }
  return false;
}

Assistant:

bool operator==(const Project& lhs, const Project& rhs)
        {
            return (lhs.version == rhs.version && 
                lhs.name == rhs.name &&
                lhs.author == rhs.author &&
                lhs.notes == rhs.notes &&
                lhs.showNotes == rhs.showNotes &&
                lhs.values == rhs.values);
        }